

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polpak.cpp
# Opt level: O3

int collatz_count(int n)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  
  iVar2 = 1;
  if (1 < n) {
    do {
      uVar3 = (uint)n >> 1;
      iVar2 = iVar2 + 1;
      uVar1 = n & 1;
      n = n * 3 + 1;
      if (uVar1 == 0) {
        n = uVar3;
      }
    } while (1 < (uint)n);
  }
  return iVar2;
}

Assistant:

int collatz_count ( int n )

//****************************************************************************80
//
//  Purpose:
//
//    COLLATZ_COUNT counts the number of terms in a Collatz sequence.
//
//  Discussion:
//
//    The rules for generation of the Collatz sequence are recursive.
//    If T is the current entry of the sequence, (T is
//    assumed to be a positive integer), then the next
//    entry, U is determined as follows:
//
//      if T is 1 (or less)
//        terminate the sequence;
//      else if T is even
//        U = T/2.
//      else (if T is odd and not 1)
//        U = 3*T+1;
//
//     N  Sequence                                                Length
//
//     1                                                               1
//     2   1                                                           2
//     3  10,  5, 16,  8,  4,  2,  1                                   8
//     4   2   1                                                       3
//     5  16,  8,  4,  2,  1                                           6
//     6   3, 10,  5, 16,  8,  4,  2,  1                               9
//     7  22, 11, 34, 17, 52, 26, 13, 40, 20, 10, 5, 16, 8, 4, 2, 1   17
//     8   4,  2,  1                                                   4
//     9  28, 14,  7, ...                                             20
//    10   5, 16,  8,  4,  2,  1                                       7
//    11  34, 17, 52, 26, 13, 40, 20, 10,  5, 16, 8, 4, 2, 1          15
//    12   6,  3, 10,  5, 16,  8,  4,  2,  1                          10
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license. 
//
//  Modified:
//
//    09 March 2006
//
//  Author:
//
//    John Burkardt
//
//  Reference:
//
//    Eric Weisstein,
//    CRC Concise Encyclopedia of Mathematics,
//    CRC Press, 2002,
//    Second edition,
//    ISBN: 1584883472,
//    LC: QA5.W45.
//
//  Parameters:
//
//    Input, int N, the first element of the sequence.
//
//    Output, int COLLATZ_COUNT, the number of elements in
//    the Collatz sequence that begins with N.
//
{
  int count;

  count = 1;

  for ( ; ; )
  {
    if ( n <= 1 )
    {
      break;
    }
    else if ( ( n % 2 ) == 0 )
    {
      n = n / 2;
    }
    else
    {
      n = 3 * n + 1;
    }
    count = count + 1;
  }

  return count;
}